

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::IsVisibleToPlayer(AActor *this)

{
  long lVar1;
  long *plVar2;
  Node *pNVar3;
  undefined8 *puVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node *pNVar8;
  undefined8 *puVar9;
  ulong uVar10;
  bool bVar11;
  PClass *pPVar7;
  
  lVar6 = (long)consoleplayer;
  lVar1 = (&DAT_017e1fb8)[lVar6 * 0x54];
  if (lVar1 != 0) {
    if ((*(byte *)(lVar1 + 0x20) & 0x20) != 0) {
      (&DAT_017e1fb8)[lVar6 * 0x54] = 0;
      return true;
    }
    if ((this->VisibleToTeam != 0) && (teamplay.Value)) {
      puVar4 = (undefined8 *)
               ((ulong)(((&DAT_017e1e88)[lVar6 * 0xa8] - 1 & 0x203) * 0x18) +
               (&DAT_017e1e78)[lVar6 * 0x54]);
      do {
        puVar9 = puVar4;
        puVar4 = (undefined8 *)*puVar9;
      } while (*(int *)(puVar9 + 1) != 0x203);
      if (this->VisibleToTeam - 1 != *(int *)(puVar9[2] + 0x28)) {
        return false;
      }
    }
    plVar2 = *(long **)(lVar1 + 0x230);
    if ((plVar2 != (long *)0x0) && (*plVar2 != 0)) {
      pPVar7 = (this->super_DThinker).super_DObject.Class;
      if (pPVar7 == (PClass *)0x0) {
        iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        pPVar7 = (PClass *)CONCAT44(extraout_var,iVar5);
        (this->super_DThinker).super_DObject.Class = pPVar7;
      }
      if (*(int *)((long)&pPVar7[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.Symbols.Symbols.LastFree + 4) != 0) {
        uVar10 = 0;
        do {
          if (pPVar7 == (PClass *)0x0) {
            iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
            pPVar7 = (PClass *)CONCAT44(extraout_var_00,iVar5);
            (this->super_DThinker).super_DObject.Class = pPVar7;
          }
          bVar11 = uVar10 < *(uint *)((long)&pPVar7[1].super_PNativeStruct.super_PStruct.
                                             super_PNamedType.super_PCompoundType.super_PType.
                                             Symbols.Symbols.LastFree + 4);
          if (!bVar11) {
            return false;
          }
          pNVar3 = (&(pPVar7[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.Symbols.Symbols.Nodes)->Next)[uVar10];
          if (pNVar3 != (Node *)0x0) {
            puVar4 = (undefined8 *)*plVar2;
            pNVar8 = (Node *)puVar4[1];
            if (pNVar8 == (Node *)0x0) {
              pNVar8 = (Node *)(**(code **)*puVar4)(puVar4);
              puVar4[1] = pNVar8;
            }
            if (pNVar8 == pNVar3) {
              return true;
            }
            do {
              pNVar8 = (Node *)pNVar8[8].Pair.Value;
              if (pNVar8 == pNVar3) break;
            } while (pNVar8 != (Node *)0x0);
            if (pNVar8 != (Node *)0x0) {
              return bVar11;
            }
            pPVar7 = (this->super_DThinker).super_DObject.Class;
          }
          uVar10 = uVar10 + 1;
        } while( true );
      }
    }
  }
  return true;
}

Assistant:

bool AActor::IsVisibleToPlayer() const
{
	// [BB] Safety check. This should never be NULL. Nevertheless, we return true to leave the default ZDoom behavior unaltered.
	if ( players[consoleplayer].camera == NULL )
		return true;
 
	if (VisibleToTeam != 0 && teamplay &&
		(signed)(VisibleToTeam-1) != players[consoleplayer].userinfo.GetTeam() )
		return false;

	const player_t* pPlayer = players[consoleplayer].camera->player;

	if (pPlayer && pPlayer->mo && GetClass()->VisibleToPlayerClass.Size() > 0)
	{
		bool visible = false;
		for(unsigned int i = 0;i < GetClass()->VisibleToPlayerClass.Size();++i)
		{
			PClassPlayerPawn *cls = GetClass()->VisibleToPlayerClass[i];
			if (cls && pPlayer->mo->GetClass()->IsDescendantOf(cls))
			{
				visible = true;
				break;
			}
		}
		if (!visible)
			return false;
	}

	// [BB] Passed all checks.
	return true;
}